

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall
capnp::DynamicList::Reader::operator[](Reader *__return_storage_ptr__,Reader *this,uint index)

{
  double value;
  PointerReader reader;
  ListReader reader_00;
  StructReader reader_01;
  ListSchema schema;
  bool value_00;
  char value_01;
  uchar value_02;
  ElementSize expectedElementSize;
  Which WVar1;
  short value_03;
  unsigned_short uVar2;
  uint uVar3;
  int value_04;
  uint uVar4;
  long value_05;
  unsigned_long value_06;
  float value_07;
  Type TVar5;
  DynamicEnum value_08;
  PointerReader local_260;
  undefined1 local_240 [48];
  PointerReader local_210;
  Reader local_1f0;
  Schema local_1d0;
  DynamicEnum local_1c8;
  StructReader local_1b8;
  Schema local_188;
  Reader local_180;
  PointerReader local_148;
  ListReader local_128;
  Type local_f8;
  Reader local_e8;
  undefined1 local_a8 [8];
  ListSchema elementType;
  ArrayPtr<const_unsigned_char> local_78;
  PointerReader local_68;
  StringPtr local_48 [2];
  Fault local_28;
  Fault f;
  uint index_local;
  Reader *this_local;
  
  f.exception._4_4_ = index;
  uVar3 = size(this);
  if (uVar3 <= index) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x410,FAILED,"index < size()","\"List index out-of-bounds.\"",
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  WVar1 = ListSchema::whichElementType(&this->schema);
  switch(WVar1) {
  case VOID:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListReader::getDataElement<capnp::Void>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__);
    break;
  case BOOL:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_00 = capnp::_::ListReader::getDataElement<bool>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_00);
    break;
  case INT8:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_01 = capnp::_::ListReader::getDataElement<signed_char>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_01);
    break;
  case INT16:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_03 = capnp::_::ListReader::getDataElement<short>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_03);
    break;
  case INT32:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_04 = capnp::_::ListReader::getDataElement<int>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_04);
    break;
  case INT64:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_05 = capnp::_::ListReader::getDataElement<long>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_05);
    break;
  case UINT8:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_02 = capnp::_::ListReader::getDataElement<unsigned_char>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_02);
    break;
  case UINT16:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    uVar2 = capnp::_::ListReader::getDataElement<unsigned_short>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,uVar2);
    break;
  case UINT32:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    uVar4 = capnp::_::ListReader::getDataElement<unsigned_int>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,uVar4);
    break;
  case UINT64:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_06 = capnp::_::ListReader::getDataElement<unsigned_long>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_06);
    break;
  case FLOAT32:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value_07 = capnp::_::ListReader::getDataElement<float>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_07);
    break;
  case FLOAT64:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    value = capnp::_::ListReader::getDataElement<double>(&this->reader,uVar4);
    DynamicValue::Reader::Reader(__return_storage_ptr__,value);
    break;
  case TEXT:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListReader::getPointerElement(&local_68,&this->reader,uVar4);
    local_48[0].content =
         (ArrayPtr<const_char>)
         capnp::_::PointerReader::getBlob<capnp::Text>(&local_68,(void *)0x0,0);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)local_48);
    break;
  case DATA:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListReader::getPointerElement
              ((PointerReader *)&elementType.elementType.field_4,&this->reader,uVar4);
    local_78 = (ArrayPtr<const_unsigned_char>)
               capnp::_::PointerReader::getBlob<capnp::Data>
                         ((PointerReader *)&elementType.elementType.field_4,(void *)0x0,0);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)&local_78);
    break;
  case LIST:
    TVar5 = (Type)ListSchema::getListElementType(&this->schema);
    local_a8 = TVar5._0_8_;
    local_f8.baseType = local_a8._0_2_;
    local_f8.listDepth = local_a8[2];
    local_f8.isImplicitParam = (bool)local_a8[3];
    local_f8.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_a8._4_2_;
    local_f8._6_2_ = local_a8._6_2_;
    elementType.elementType._0_8_ = TVar5.field_4;
    local_f8.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)elementType.elementType._0_8_;
    _local_a8 = TVar5;
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListReader::getPointerElement(&local_148,&this->reader,uVar4);
    WVar1 = ListSchema::whichElementType((ListSchema *)local_a8);
    expectedElementSize = anon_unknown_70::elementSizeFor(WVar1);
    capnp::_::PointerReader::getList(&local_128,&local_148,expectedElementSize,(word *)0x0);
    schema.elementType.field_4.schema = local_f8.field_4.schema;
    schema.elementType.baseType = local_f8.baseType;
    schema.elementType.listDepth = local_f8.listDepth;
    schema.elementType.isImplicitParam = local_f8.isImplicitParam;
    schema.elementType.field_3 = local_f8.field_3;
    schema.elementType._6_2_ = local_f8._6_2_;
    reader_00.capTable = local_128.capTable;
    reader_00.segment = local_128.segment;
    reader_00.ptr = local_128.ptr;
    reader_00.elementCount = local_128.elementCount;
    reader_00.step = local_128.step;
    reader_00.structDataSize = local_128.structDataSize;
    reader_00.structPointerCount = local_128.structPointerCount;
    reader_00.elementSize = local_128.elementSize;
    reader_00._39_1_ = local_128._39_1_;
    reader_00.nestingLimit = local_128.nestingLimit;
    reader_00._44_4_ = local_128._44_4_;
    Reader(&local_e8,schema,reader_00);
    DynamicValue::Reader::Reader(__return_storage_ptr__,&local_e8);
    break;
  case ENUM:
    local_1d0.raw = (RawBrandedSchema *)ListSchema::getEnumElementType(&this->schema);
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    uVar2 = capnp::_::ListReader::getDataElement<unsigned_short>(&this->reader,uVar4);
    DynamicEnum::DynamicEnum(&local_1c8,(EnumSchema)local_1d0.raw,uVar2);
    value_08._10_6_ = 0;
    value_08.schema.super_Schema.raw = local_1c8.schema.super_Schema.raw;
    value_08.value = local_1c8.value;
    DynamicValue::Reader::Reader(__return_storage_ptr__,value_08);
    break;
  case STRUCT:
    local_188.raw = (RawBrandedSchema *)ListSchema::getStructElementType(&this->schema);
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListReader::getStructElement(&local_1b8,&this->reader,uVar4);
    reader_01.capTable = local_1b8.capTable;
    reader_01.segment = local_1b8.segment;
    reader_01.data = local_1b8.data;
    reader_01.pointers = local_1b8.pointers;
    reader_01.dataSize = local_1b8.dataSize;
    reader_01.pointerCount = local_1b8.pointerCount;
    reader_01._38_2_ = local_1b8._38_2_;
    reader_01.nestingLimit = local_1b8.nestingLimit;
    reader_01._44_4_ = local_1b8._44_4_;
    DynamicStruct::Reader::Reader(&local_180,(StructSchema)local_188.raw,reader_01);
    DynamicValue::Reader::Reader(__return_storage_ptr__,&local_180);
    break;
  case INTERFACE:
    local_240._16_8_ = ListSchema::getInterfaceElementType(&this->schema);
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListReader::getPointerElement(&local_260,&this->reader,uVar4);
    capnp::_::PointerReader::getCapability((PointerReader *)local_240);
    DynamicCapability::Client::Client
              ((Client *)(local_240 + 0x18),(InterfaceSchema)local_240._16_8_,
               (Own<capnp::ClientHook> *)local_240);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Client *)(local_240 + 0x18));
    DynamicCapability::Client::~Client((Client *)(local_240 + 0x18));
    kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)local_240);
    break;
  case ANY_POINTER:
    uVar4 = bounded<unsigned_int>(f.exception._4_4_);
    capnp::_::ListReader::getPointerElement(&local_210,&this->reader,uVar4);
    reader.capTable = local_210.capTable;
    reader.segment = local_210.segment;
    reader.pointer = local_210.pointer;
    reader.nestingLimit = local_210.nestingLimit;
    reader._28_4_ = local_210._28_4_;
    AnyPointer::Reader::Reader(&local_1f0,reader);
    DynamicValue::Reader::Reader(__return_storage_ptr__,&local_1f0);
    break;
  default:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicList::Reader::operator[](uint index) const {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return reader.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();
      return DynamicList::Reader(elementType,
          reader.getPointerElement(bounded(index) * ELEMENTS)
                .getList(elementSizeFor(elementType.whichElementType()), nullptr));
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Reader(schema.getStructElementType(),
                                   reader.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         reader.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      return AnyPointer::Reader(reader.getPointerElement(bounded(index) * ELEMENTS));

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       reader.getPointerElement(bounded(index) * ELEMENTS)
                                             .getCapability());
  }

  return nullptr;
}